

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall FNodeBuilder::CreateSeg(FNodeBuilder *this,int linenum,int sidenum)

{
  line_t *plVar1;
  FPrivVert *pFVar2;
  uint uVar3;
  line_t *plVar4;
  line_t *plVar5;
  sector_t **ppsVar6;
  sector_t **ppsVar7;
  FPrivSeg local_58;
  
  local_58.next = 0xffffffff;
  local_58.loopnum = 0;
  local_58.partner = 0xffffffff;
  local_58.hashnext = (FPrivSeg *)0x0;
  local_58.planefront = false;
  local_58.storedseg = 0xffffffff;
  local_58.planenum = -1;
  plVar5 = this->Level->Lines;
  plVar1 = plVar5 + linenum;
  if (sidenum == 0) {
    ppsVar6 = &plVar5[linenum].frontsector;
    ppsVar7 = &plVar5[linenum].backsector;
    plVar4 = (line_t *)&plVar5[linenum].v2;
    plVar5 = plVar1;
  }
  else {
    ppsVar6 = &plVar5[linenum].backsector;
    ppsVar7 = &plVar5[linenum].frontsector;
    plVar4 = plVar1;
    plVar5 = (line_t *)&plVar5[linenum].v2;
  }
  local_58.backsector = *ppsVar7;
  local_58.frontsector = *ppsVar6;
  local_58.v1 = (int)plVar5->v1;
  local_58.v2 = (int)plVar4->v1;
  if (plVar1->sidedef[sidenum] == (side_t *)0x0) {
    local_58.sidedef = -1;
  }
  else {
    local_58.sidedef = (int)(((long)plVar1->sidedef[sidenum] - (long)sides) / 0xd8);
  }
  pFVar2 = (this->Vertices).Array;
  local_58.nextforvert = pFVar2[local_58.v1].segs;
  local_58.nextforvert2 = pFVar2[local_58.v2].segs2;
  local_58.linedef = linenum;
  uVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push(&this->Segs,&local_58);
  pFVar2 = (this->Vertices).Array;
  pFVar2[local_58.v1].segs = uVar3;
  pFVar2[local_58.v2].segs2 = uVar3;
  return uVar3;
}

Assistant:

int FNodeBuilder::CreateSeg (int linenum, int sidenum)
{
	FPrivSeg seg;
	int segnum;

	seg.next = DWORD_MAX;
	seg.loopnum = 0;
	seg.partner = DWORD_MAX;
	seg.hashnext = NULL;
	seg.planefront = false;
	seg.planenum = DWORD_MAX;
	seg.storedseg = DWORD_MAX;

	if (sidenum == 0)
	{ // front
		seg.frontsector = Level.Lines[linenum].frontsector;
		seg.backsector = Level.Lines[linenum].backsector;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v2;
	}
	else
	{ // back
		seg.frontsector = Level.Lines[linenum].backsector;
		seg.backsector = Level.Lines[linenum].frontsector;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v2;
	}
	seg.linedef = linenum;
	side_t *sd = Level.Lines[linenum].sidedef[sidenum];
	seg.sidedef = sd != NULL? int(sd - sides) : int(NO_SIDE);
	seg.nextforvert = Vertices[seg.v1].segs;
	seg.nextforvert2 = Vertices[seg.v2].segs2;

	segnum = (int)Segs.Push (seg);
	Vertices[seg.v1].segs = segnum;
	Vertices[seg.v2].segs2 = segnum;
	D(Printf(PRINT_LOG, "Seg %4d: From line %d, side %s (%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", segnum, linenum, sidenum ? "back " : "front",
		Vertices[seg.v1].x>>16, Vertices[seg.v1].y>>16, Vertices[seg.v2].x>>16, Vertices[seg.v2].y>>16,
		Vertices[seg.v1].x, Vertices[seg.v1].y, Vertices[seg.v2].x, Vertices[seg.v2].y));

	return segnum;
}